

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button,float lock_threshold)

{
  ImGuiContext *pIVar1;
  bool bVar2;
  bool local_21;
  ImGuiContext *g;
  float lock_threshold_local;
  ImGuiMouseButton button_local;
  
  pIVar1 = GImGui;
  local_21 = 4 < (uint)button;
  if (local_21) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*(g.IO.MouseDown))))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.cpp"
                  ,0x12c0,"ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton, float)");
  }
  g._0_4_ = lock_threshold;
  if (lock_threshold < 0.0) {
    g._0_4_ = (GImGui->IO).MouseDragThreshold;
  }
  if ((((((GImGui->IO).MouseDown[button] & 1U) == 0) &&
       (((GImGui->IO).MouseReleased[button] & 1U) == 0)) ||
      ((GImGui->IO).MouseDragMaxDistanceSqr[button] < g._0_4_ * g._0_4_)) ||
     ((bVar2 = IsMousePosValid(&(GImGui->IO).MousePos), !bVar2 ||
      (bVar2 = IsMousePosValid((pIVar1->IO).MouseClickedPos + button), !bVar2)))) {
    ImVec2::ImVec2((ImVec2 *)&lock_threshold_local,0.0,0.0);
  }
  else {
    _lock_threshold_local = operator-(&(pIVar1->IO).MousePos,(pIVar1->IO).MouseClickedPos + button);
  }
  return _lock_threshold_local;
}

Assistant:

ImVec2 ImGui::GetMouseDragDelta(ImGuiMouseButton button, float lock_threshold)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    if (lock_threshold < 0.0f)
        lock_threshold = g.IO.MouseDragThreshold;
    if (g.IO.MouseDown[button] || g.IO.MouseReleased[button])
        if (g.IO.MouseDragMaxDistanceSqr[button] >= lock_threshold * lock_threshold)
            if (IsMousePosValid(&g.IO.MousePos) && IsMousePosValid(&g.IO.MouseClickedPos[button]))
                return g.IO.MousePos - g.IO.MouseClickedPos[button];
    return ImVec2(0.0f, 0.0f);
}